

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

log * __thiscall leveldb::log::RandomSkewedString_abi_cxx11_(log *this,int i,Random *rnd)

{
  uint32_t uVar1;
  log local_40 [32];
  Random *local_20;
  Random *rnd_local;
  log *plStack_10;
  int i_local;
  
  local_20 = rnd;
  rnd_local._4_4_ = i;
  plStack_10 = this;
  NumberString_abi_cxx11_(local_40,i);
  uVar1 = Random::Skewed(local_20,0x11);
  BigString(this,(string *)local_40,(ulong)uVar1);
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

static std::string RandomSkewedString(int i, Random* rnd) {
  return BigString(NumberString(i), rnd->Skewed(17));
}